

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_1,__1,__1> *dst,Matrix<double,__1,__1,_1,__1,__1> *src,
               assign_op<double,_double> *func)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong cols;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  ulong uVar7;
  undefined8 *puVar8;
  Index index;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  pdVar3 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data;
  uVar10 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  cols = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows !=
       uVar10) ||
     (uVar7 = cols, uVar9 = uVar10,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(cols | uVar10) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    if ((cols != 0 && uVar10 != 0) &&
       (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar5 / SEXT816((long)cols),0) < (long)uVar10)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar5 % SEXT816((long)cols),0));
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)dst,cols * uVar10,uVar10,cols);
    uVar9 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows
    ;
    uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((uVar9 == uVar10) && (uVar7 == cols)) {
    pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
             m_data;
    lVar12 = cols * uVar10;
    uVar10 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar12) {
      lVar11 = 0;
      do {
        pdVar1 = pdVar3 + lVar11;
        dVar6 = pdVar1[1];
        pdVar2 = pdVar4 + lVar11;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar6;
        lVar11 = lVar11 + 2;
      } while (lVar11 < (long)uVar10);
    }
    if ((long)uVar10 < lVar12) {
      do {
        pdVar4[uVar10] = pdVar3[uVar10];
        uVar10 = uVar10 + 1;
      } while (lVar12 - uVar10 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2eb,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}